

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t locale_canonKeywordName(char *buf,char *keywordName,UErrorCode *status)

{
  UBool UVar1;
  char cVar2;
  int32_t keywordNameLen;
  long lVar3;
  
  lVar3 = 0;
  do {
    if (keywordName[lVar3] == '\0') {
      if (lVar3 == 0) {
LAB_002a5b75:
        *status = U_ILLEGAL_ARGUMENT_ERROR;
LAB_002a5b7c:
        lVar3 = 0;
      }
      else {
        buf[lVar3] = '\0';
      }
      return (int32_t)lVar3;
    }
    UVar1 = uprv_isASCIILetter_63(keywordName[lVar3]);
    if ((UVar1 == '\0') && (9 < (byte)(keywordName[lVar3] - 0x30U))) goto LAB_002a5b75;
    if (lVar3 == 0x18) {
      *status = U_INTERNAL_PROGRAM_ERROR;
      goto LAB_002a5b7c;
    }
    cVar2 = uprv_asciitolower_63(keywordName[lVar3]);
    buf[lVar3] = cVar2;
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

static int32_t locale_canonKeywordName(char *buf, const char *keywordName, UErrorCode *status)
{
  int32_t keywordNameLen = 0;

  for (; *keywordName != 0; keywordName++) {
    if (!UPRV_ISALPHANUM(*keywordName)) {
      *status = U_ILLEGAL_ARGUMENT_ERROR; /* malformed keyword name */
      return 0;
    }
    if (keywordNameLen < ULOC_KEYWORD_BUFFER_LEN - 1) {
      buf[keywordNameLen++] = uprv_tolower(*keywordName);
    } else {
      /* keyword name too long for internal buffer */
      *status = U_INTERNAL_PROGRAM_ERROR;
      return 0;
    }
  }
  if (keywordNameLen == 0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR; /* empty keyword name */
    return 0;
  }
  buf[keywordNameLen] = 0; /* terminate */

  return keywordNameLen;
}